

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O1

void __thiscall
DeviceGroup::init<AudioEnumerator>
          (DeviceGroup *this,AudioEnumerator *enumerator,int backend,int device)

{
  QComboBox *pQVar1;
  QLabel *pQVar2;
  bool bVar3;
  uint uVar4;
  QArrayDataPointer<QString> local_40;
  
  pQVar1 = this->mApiCombo;
  AudioEnumerator::backendNames(enumerator);
  uVar4 = QComboBox::count();
  QComboBox::insertItems((int)pQVar1,(QList *)(ulong)uVar4);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  QComboBox::setCurrentIndex((int)this->mApiCombo);
  populateDevices<AudioEnumerator>(this,enumerator);
  QComboBox::setCurrentIndex((int)this->mDeviceCombo);
  pQVar2 = this->mErrorLabel;
  bVar3 = AudioEnumerator::backendIsAvailable(enumerator,backend);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,!bVar3);
  return;
}

Assistant:

void init(Enumerator const& enumerator, int backend, int device) {
        mApiCombo->addItems(enumerator.backendNames());
        mApiCombo->setCurrentIndex(backend);
        populateDevices(enumerator);
        mDeviceCombo->setCurrentIndex(device);
        mErrorLabel->setVisible(!enumerator.backendIsAvailable(backend));
    }